

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int twacf(double *P,int MP,double *Q,int MQ,double *ACF,int MA,double *CVLI,int MXPQ1,double *ALPHA,
         int MXPQ)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  
  iVar2 = imax(MP,MQ);
  uVar3 = 2;
  if (iVar2 == MXPQ) {
    uVar3 = (uint)(MQ | MP) >> 0x1f;
  }
  uVar1 = MXPQ + 1;
  uVar7 = 3;
  if (uVar1 == MXPQ1) {
    uVar7 = uVar3;
  }
  uVar3 = 4;
  if (MXPQ1 <= MA) {
    uVar3 = uVar7;
  }
  if (uVar3 == 0) {
    *ACF = 1.0;
    *CVLI = 1.0;
    uVar3 = 0;
    if (MA != 1) {
      if (1 < MA) {
        memset(ACF + 1,0,(ulong)(MA - 1) << 3);
      }
      uVar3 = 0;
      if (MXPQ1 != 1) {
        if (1 < MXPQ1) {
          memset(CVLI + 1,0,(ulong)(MXPQ1 - 1) << 3);
        }
        uVar6 = (ulong)(uint)MXPQ;
        if (0 < MXPQ) {
          memset(ALPHA,0,uVar6 * 8);
        }
        if ((MQ != 0) && (0 < MQ)) {
          uVar12 = 1;
          uVar8 = (ulong)(uint)MQ;
          pdVar11 = Q;
          do {
            pdVar11 = pdVar11 + 1;
            CVLI[uVar12] = -Q[uVar12 - 1];
            ACF[uVar12] = -Q[uVar12 - 1];
            if (uVar12 < (uint)MQ) {
              dVar16 = ACF[uVar12];
              lVar13 = 0;
              do {
                dVar16 = dVar16 + Q[lVar13] * pdVar11[lVar13];
                ACF[uVar12] = dVar16;
                lVar13 = lVar13 + 1;
              } while (uVar8 - 1 != lVar13);
            }
            *ACF = Q[uVar12 - 1] * Q[uVar12 - 1] + *ACF;
            uVar12 = uVar12 + 1;
            uVar8 = (ulong)((int)uVar8 - 1);
          } while (uVar12 != MQ + 1);
        }
        if (MP == 0) {
          uVar3 = 0;
        }
        else {
          if (0 < MP) {
            uVar8 = 0;
            do {
              ALPHA[uVar8] = P[uVar8];
              CVLI[uVar8] = P[uVar8];
              uVar8 = uVar8 + 1;
            } while ((uint)MP != uVar8);
          }
          lVar13 = (long)MP;
          if (0 < MXPQ) {
            pdVar10 = CVLI + (uVar6 - 2);
            pdVar11 = ALPHA + (uVar6 - 1);
            uVar8 = 1;
            uVar3 = MXPQ;
            do {
              lVar14 = uVar6 - uVar8;
              if (lVar14 < lVar13) {
                dVar16 = 1.0 - ALPHA[lVar14] * ALPHA[lVar14];
                if (dVar16 <= 1e-10) {
                  return 5;
                }
                if (uVar8 == uVar6) break;
                if (0 < lVar14) {
                  lVar4 = 0;
                  pdVar9 = pdVar10;
                  do {
                    ALPHA[lVar4] = (ALPHA[lVar14] * *pdVar9 + CVLI[lVar4]) / dVar16;
                    pdVar9 = pdVar9 + -1;
                    lVar4 = lVar4 + 1;
                  } while ((ulong)uVar3 - 1 != lVar4);
                }
              }
              if (lVar14 < MQ) {
                iVar2 = imax(((int)lVar14 - MP) + 1,1);
                lVar4 = (long)iVar2;
                if (lVar4 <= lVar14) {
                  lVar5 = lVar4 + -1;
                  pdVar9 = pdVar11 + -lVar4;
                  do {
                    ACF[lVar5 + 1] = ACF[lVar14 + 1] * *pdVar9 + ACF[lVar5 + 1];
                    lVar5 = lVar5 + 1;
                    pdVar9 = pdVar9 + -1;
                  } while (lVar5 < lVar14);
                }
              }
              if (0 < lVar14 && lVar14 < lVar13) {
                lVar14 = 0;
                do {
                  CVLI[lVar14] = ALPHA[lVar14];
                  lVar14 = lVar14 + 1;
                } while ((ulong)uVar3 - 1 != lVar14);
              }
              uVar8 = uVar8 + 1;
              uVar3 = uVar3 - 1;
              pdVar10 = pdVar10 + -1;
              pdVar11 = pdVar11 + -1;
            } while (uVar8 != uVar1);
          }
          *ACF = *ACF * 0.5;
          if (0 < MXPQ) {
            uVar6 = 1;
            lVar14 = 0x10;
            do {
              if ((long)uVar6 <= lVar13) {
                dVar16 = ALPHA[uVar6 - 1];
                lVar4 = 0;
                uVar8 = uVar6;
                do {
                  *(double *)((long)CVLI + lVar4) =
                       (ALPHA[uVar6 - 1] * ACF[uVar8] + *(double *)((long)ACF + lVar4)) /
                       (1.0 - dVar16 * dVar16);
                  lVar4 = lVar4 + 8;
                  bVar15 = uVar8 != 0;
                  uVar8 = uVar8 - 1;
                } while (bVar15);
                lVar4 = 0;
                do {
                  *(undefined8 *)((long)ACF + lVar4) = *(undefined8 *)((long)CVLI + lVar4);
                  lVar4 = lVar4 + 8;
                } while (lVar14 != lVar4);
              }
              uVar6 = uVar6 + 1;
              lVar14 = lVar14 + 8;
            } while (uVar6 != uVar1);
          }
          if (0 < MA) {
            uVar6 = 1;
            pdVar11 = ACF;
            do {
              iVar2 = imin((int)uVar6 + -1,MP);
              if (0 < iVar2) {
                dVar16 = ACF[uVar6 - 1];
                lVar13 = -1;
                pdVar10 = P;
                do {
                  dVar16 = dVar16 + *pdVar10 * pdVar11[lVar13];
                  ACF[uVar6 - 1] = dVar16;
                  pdVar10 = pdVar10 + 1;
                  lVar13 = lVar13 + -1;
                } while (-lVar13 != (ulong)(iVar2 + 1));
              }
              uVar6 = uVar6 + 1;
              pdVar11 = pdVar11 + 1;
            } while (uVar6 != MA + 1);
          }
          *ACF = *ACF + *ACF;
          *CVLI = 1.0;
          uVar3 = 0;
          if (0 < MQ) {
            uVar6 = 1;
            pdVar11 = CVLI;
            do {
              CVLI[uVar6] = -Q[uVar6 - 1];
              iVar2 = imin((int)uVar6,MP);
              if (0 < iVar2) {
                dVar16 = CVLI[uVar6];
                lVar13 = 0;
                pdVar10 = P;
                do {
                  dVar16 = dVar16 + *pdVar10 * pdVar11[lVar13];
                  CVLI[uVar6] = dVar16;
                  pdVar10 = pdVar10 + 1;
                  lVar13 = lVar13 + -1;
                } while (1 - (ulong)(iVar2 + 1) != lVar13);
              }
              uVar6 = uVar6 + 1;
              pdVar11 = pdVar11 + 1;
              uVar3 = 0;
            } while (uVar6 != MQ + 1);
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int twacf(double *P, int MP, double *Q, int MQ, double *ACF, int MA, double *CVLI, int MXPQ1, double *ALPHA, int MXPQ) {
	int ifault, i, k, kc, j, jpk, kcp1mj, j1, kp1, kp2mj, miim1p, imj, mikp, kp1mj;
	double epsil2, zero, one, half, two, div;

	ifault = 0;
	epsil2 = 1.0e-10;
	zero = 0.0; half = 0.5, one = 1.0, two = 2.0;

	if (MP < 0 || MQ < 0) {
		ifault = 1;
	}
	if (MXPQ != imax(MP, MQ)) {
		ifault = 2;
	}
	if (MXPQ1 != MXPQ + 1) {
		ifault = 3;
	}
	if (MA < MXPQ1) {
		ifault = 4;
	}

	if (ifault > 0) {
		return ifault;
	}

	// Initialization and return if MP = MQ = 0

	ACF[0] = one;
	CVLI[0] = one;

	if (MA == 1) {
		return ifault;
	}

	for (i = 1; i < MA; ++i) {
		ACF[i] = zero;
	}

	if (MXPQ1 == 1) {
		return ifault;
	}

	for (i = 1; i < MXPQ1; ++i) {
		CVLI[i] = zero;
	}
	for (k = 0; k < MXPQ; ++k) {
		ALPHA[k] = 0.0;
	}

	// Computation of the A.C.F. of the moving average part stored in ACF

	if (MQ != 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			ACF[k] = -Q[k - 1];
			kc = MQ - k;
			if (kc != 0) {
				for (j = 1; j <= kc; ++j) {
					jpk = j + k;
					ACF[k] += (Q[j - 1] * Q[jpk - 1]);
				}
			}//120
			ACF[0] += (Q[k - 1] * Q[k - 1]);
		}

		//Initialization of CVLI = T.W.-S.PHI -- return if MP = 0
	}//180

	if (MP == 0) {
		return ifault;
	}

	for (k = 0; k < MP; ++k) {
		ALPHA[k] = P[k];
		CVLI[k] = P[k];
	}

	// Computation of T.W.-S ALPHA and DELTA
	// DELTA stored in ACF which is gradually overwritten

	for (k = 1; k <= MXPQ; ++k) {
		kc = MXPQ - k;
		if (kc < MP) {
			div = one - ALPHA[kc] * ALPHA[kc];
			if (div <= epsil2) {
				return 5;
			}
			if (kc == 0) {
				break; //break For loop. Go to 290
			}//290
			for (j = 1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ALPHA[j - 1] = (CVLI[j - 1] + ALPHA[kc] * CVLI[kcp1mj]) / div;
			}
		}//240
		if (kc < MQ) {
			j1 = imax(kc + 1 - MP, 1);
			for (j = j1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ACF[j] += ACF[kc + 1] * ALPHA[kcp1mj];
			}
		}//260
		if (kc < MP) {
			for (j = 1; j <= kc; ++j) {
				CVLI[j - 1] = ALPHA[j - 1];
			}
		}
	}//290

	// Computation of T.W.-S NU
	// NU is stored in CVLI copied into ACF

	ACF[0] *= half;
	for (k = 1; k <= MXPQ; ++k) {
		if (k <= MP) {
			kp1 = k + 1;
			div = one - ALPHA[k - 1] * ALPHA[k - 1];
			for (j = 1; j <= kp1; ++j) {
				kp2mj = k + 2 - j;
				CVLI[j - 1] = (ACF[j - 1] + ALPHA[k - 1] * ACF[kp2mj - 1]) / div;
			}
			for (j = 1; j <= kp1; ++j) {
				ACF[j - 1] = CVLI[j - 1];
			}
		}//330
	}//330

	//Computation of ACF

	for (i = 1; i <= MA; ++i) {
		miim1p = imin(i - 1, MP);
		if (miim1p != 0) {
			for (j = 1; j <= miim1p; ++j) {
				imj = i - j; 
				ACF[i - 1] += P[j - 1] * ACF[imj - 1];
			}
		}//430
	}//430

	ACF[0] *= two;

	//Computation of CVLI

	CVLI[0] = one;
	if (MQ > 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			if (MP != 0) {
				mikp = imin(k, MP);
				for (j = 1; j <= mikp; ++j) {
					kp1mj = k + 1 - j;
					CVLI[k] += P[j - 1] * CVLI[kp1mj - 1];
				}
			}
		}
	}

	return ifault;
}